

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

string * __thiscall
BuildStatus::FormatProgressStatus_abi_cxx11_
          (string *__return_storage_ptr__,BuildStatus *this,char *progress_status_format,
          EdgeStatus status)

{
  Stopwatch *this_00;
  char cVar1;
  SlidingRateInfo *pSVar2;
  uint64_t uVar3;
  long lVar4;
  ulong uVar5;
  char *__format;
  char cVar6;
  undefined1 auVar7 [16];
  char buf [32];
  _Alloc_hider local_80;
  size_type local_78;
  char local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  string *local_60;
  char local_58 [40];
  
  local_80._M_p = &local_70;
  local_78 = 0;
  local_70 = '\0';
  this_00 = &(this->overall_rate_).stopwatch_;
  local_60 = __return_storage_ptr__;
  do {
    cVar6 = (char)&local_80;
    if (*progress_status_format != '%') {
      if (*progress_status_format == '\0') {
        (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
        if (local_80._M_p == &local_70) {
          (local_60->field_2)._M_allocated_capacity = CONCAT71(uStack_6f,local_70);
          *(undefined8 *)((long)&local_60->field_2 + 8) = uStack_68;
        }
        else {
          (local_60->_M_dataplus)._M_p = local_80._M_p;
          (local_60->field_2)._M_allocated_capacity = CONCAT71(uStack_6f,local_70);
        }
        local_60->_M_string_length = local_78;
        return local_60;
      }
      std::__cxx11::string::push_back(cVar6);
      goto LAB_0010bdb0;
    }
    cVar1 = progress_status_format[1];
    progress_status_format = progress_status_format + 1;
    switch(cVar1) {
    case 'c':
      SlidingRateInfo::UpdateRate(&this->current_rate_,this->finished_edges_);
      pSVar2 = &this->current_rate_;
      goto LAB_0010bd26;
    case 'd':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'q':
switchD_0010bcc2_caseD_64:
      Fatal("unknown placeholder \'%%%c\' in $NINJA_STATUS",(ulong)(uint)(int)cVar1);
    case 'e':
      uVar3 = Stopwatch::Now(this_00);
      lVar4 = uVar3 - this_00->started_;
      auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar7._0_8_ = lVar4;
      auVar7._12_4_ = 0x45300000;
      snprintf(local_58,0x20,"%.3f",
               SUB84(((auVar7._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * 1e-06,0));
      std::__cxx11::string::append((char *)&local_80);
      goto LAB_0010bdb0;
    case 'f':
      uVar5 = (ulong)(uint)this->finished_edges_;
      break;
    case 'o':
      RateInfo::UpdateRate(&this->overall_rate_,this->finished_edges_);
      pSVar2 = (SlidingRateInfo *)&this->overall_rate_;
LAB_0010bd26:
      if ((pSVar2->rate_ != -1.0) || (NAN(pSVar2->rate_))) {
        snprintf(local_58,0x20,"%.1f");
      }
      else {
        local_58[0] = '?';
        local_58[1] = '\0';
      }
      goto LAB_0010bda5;
    case 'p':
      __format = "%3i%%";
      uVar5 = (long)(this->finished_edges_ * 100) / (long)this->total_edges_ & 0xffffffff;
      goto LAB_0010bd9e;
    case 'r':
      snprintf(local_58,0x20,"%d",
               (ulong)((this->started_edges_ + (uint)(status == kEdgeFinished)) -
                      this->finished_edges_));
      std::__cxx11::string::append((char *)&local_80);
      goto LAB_0010bdb0;
    case 's':
      uVar5 = (ulong)(uint)this->started_edges_;
      break;
    case 't':
      uVar5 = (ulong)(uint)this->total_edges_;
      break;
    case 'u':
      uVar5 = (ulong)(uint)(this->total_edges_ - this->started_edges_);
      break;
    default:
      if (cVar1 != '%') goto switchD_0010bcc2_caseD_64;
      std::__cxx11::string::push_back(cVar6);
      goto LAB_0010bdb0;
    }
    __format = "%d";
LAB_0010bd9e:
    snprintf(local_58,0x20,__format,uVar5);
LAB_0010bda5:
    std::__cxx11::string::append((char *)&local_80);
LAB_0010bdb0:
    progress_status_format = progress_status_format + 1;
  } while( true );
}

Assistant:

string BuildStatus::FormatProgressStatus(
    const char* progress_status_format, EdgeStatus status) const {
  string out;
  char buf[32];
  int percent;
  for (const char* s = progress_status_format; *s != '\0'; ++s) {
    if (*s == '%') {
      ++s;
      switch (*s) {
      case '%':
        out.push_back('%');
        break;

        // Started edges.
      case 's':
        snprintf(buf, sizeof(buf), "%d", started_edges_);
        out += buf;
        break;

        // Total edges.
      case 't':
        snprintf(buf, sizeof(buf), "%d", total_edges_);
        out += buf;
        break;

        // Running edges.
      case 'r': {
        int running_edges = started_edges_ - finished_edges_;
        // count the edge that just finished as a running edge
        if (status == kEdgeFinished)
          running_edges++;
        snprintf(buf, sizeof(buf), "%d", running_edges);
        out += buf;
        break;
      }

        // Unstarted edges.
      case 'u':
        snprintf(buf, sizeof(buf), "%d", total_edges_ - started_edges_);
        out += buf;
        break;

        // Finished edges.
      case 'f':
        snprintf(buf, sizeof(buf), "%d", finished_edges_);
        out += buf;
        break;

        // Overall finished edges per second.
      case 'o':
        overall_rate_.UpdateRate(finished_edges_);
        SnprintfRate(overall_rate_.rate(), buf, "%.1f");
        out += buf;
        break;

        // Current rate, average over the last '-j' jobs.
      case 'c':
        current_rate_.UpdateRate(finished_edges_);
        SnprintfRate(current_rate_.rate(), buf, "%.1f");
        out += buf;
        break;

        // Percentage
      case 'p':
        percent = (100 * finished_edges_) / total_edges_;
        snprintf(buf, sizeof(buf), "%3i%%", percent);
        out += buf;
        break;

      case 'e': {
        double elapsed = overall_rate_.Elapsed();
        snprintf(buf, sizeof(buf), "%.3f", elapsed);
        out += buf;
        break;
      }

      default:
        Fatal("unknown placeholder '%%%c' in $NINJA_STATUS", *s);
        return "";
      }
    } else {
      out.push_back(*s);
    }
  }

  return out;
}